

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_34::BrokenClient::BrokenClient
          (BrokenClient *this,StringPtr description,bool resolved,void *brand)

{
  StringPtr *params;
  Array<char> AStack_48;
  char *local_30;
  size_t local_28;
  
  local_28 = description.content.size_;
  local_30 = description.content.ptr;
  ClientHook::ClientHook(&this->super_ClientHook,brand);
  (this->super_Refcounted).refcount = 0;
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_003691c8;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00369218;
  kj::str<kj::StringPtr_const&>((String *)&AStack_48,(kj *)&local_30,params);
  kj::Exception::Exception(&this->exception,FAILED,"",0,(String *)&AStack_48);
  kj::Array<char>::~Array(&AStack_48);
  this->resolved = resolved;
  return;
}

Assistant:

BrokenClient(const kj::StringPtr description, bool resolved, const void* brand)
      : ClientHook(brand), exception(kj::Exception::Type::FAILED, "", 0, kj::str(description)),
        resolved(resolved) {}